

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O1

bool slang::parsing::isSameToken(Token left,Token right)

{
  Trivia *pTVar1;
  Trivia *pTVar2;
  int iVar3;
  size_t sVar4;
  Trivia *pTVar5;
  short in_DX;
  size_type sVar6;
  size_type __rlen;
  short in_DI;
  Trivia *this;
  size_type __rlen_1;
  Trivia *this_00;
  bool bVar7;
  string_view sVar8;
  string_view sVar9;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar10;
  Token local_50;
  Token local_40;
  
  if (in_DI == in_DX) {
    sVar8 = Token::rawText(&local_40);
    sVar4 = sVar8._M_len;
    sVar9 = Token::rawText(&local_50);
    if ((sVar4 == sVar9._M_len) &&
       ((sVar4 == 0 || (iVar3 = bcmp(sVar8._M_str,sVar9._M_str,sVar4), iVar3 == 0)))) {
      sVar10 = Token::trivia(&local_40);
      sVar6 = sVar10.size_;
      pTVar5 = sVar10.data_;
      sVar10 = Token::trivia(&local_50);
      if (sVar6 == sVar10.size_) {
        bVar7 = sVar6 == 0;
        if (bVar7) {
          return bVar7;
        }
        if (pTVar5->kind != (sVar10.data_)->kind) {
          return bVar7;
        }
        this = pTVar5;
        this_00 = sVar10.data_;
        do {
          sVar8 = Trivia::getRawText(this);
          sVar4 = sVar8._M_len;
          sVar9 = Trivia::getRawText(this_00);
          if (sVar4 != sVar9._M_len) {
            return bVar7;
          }
          if ((sVar4 != 0) && (iVar3 = bcmp(sVar8._M_str,sVar9._M_str,sVar4), iVar3 != 0)) {
            return bVar7;
          }
          bVar7 = this + 1 == pTVar5 + sVar6;
          if (bVar7) {
            return bVar7;
          }
          pTVar1 = this + 1;
          pTVar2 = this_00 + 1;
          this = this + 1;
          this_00 = this_00 + 1;
        } while (pTVar1->kind == pTVar2->kind);
        return bVar7;
      }
    }
  }
  return false;
}

Assistant:

static bool isSameToken(Token left, Token right) {
    if (left.kind != right.kind || left.rawText() != right.rawText())
        return false;

    auto lt = left.trivia();
    auto rt = right.trivia();
    if (lt.size() != rt.size())
        return false;

    for (auto lit = lt.begin(), rit = rt.begin(); lit != lt.end(); lit++, rit++) {
        if (lit->kind != rit->kind || lit->getRawText() != rit->getRawText())
            return false;
    }
    return true;
}